

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O3

bool tinyobj::LoadObjWithCallback
               (istream *inStream,callback_t *callback,void *user_data,MaterialReader *readMatFn,
               string *warn,string *err)

{
  byte bVar1;
  byte bVar2;
  size_t sVar3;
  pointer pbVar4;
  pointer ppcVar5;
  char cVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  size_t sVar10;
  code *pcVar11;
  iterator iVar12;
  long lVar13;
  long *plVar14;
  undefined8 uVar15;
  long *plVar16;
  _Rb_tree_color _Var17;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *elems;
  undefined1 auVar18 [8];
  ulong uVar19;
  ulong uVar20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar21;
  pointer pbVar22;
  byte *pbVar23;
  byte *pbVar24;
  size_t *psVar25;
  stringstream local_4b0 [8];
  stringstream errss;
  ios_base local_430 [264];
  undefined1 local_328 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  material_map;
  index_t idx;
  ios_base local_278 [264];
  double local_170;
  undefined1 auStack_168 [8];
  vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> materials;
  undefined1 auStack_148 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  undefined1 auStack_128 [8];
  vector<const_char_*,_std::allocator<const_char_*>_> names_out;
  string linebuf;
  undefined1 auStack_e8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filenames;
  long *local_c8;
  long local_c0;
  long local_b8;
  long lStack_b0;
  string *local_a8;
  ios_base *local_a0;
  pointer piStack_98;
  vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_> indices;
  allocator local_69;
  string *local_68;
  void *local_60;
  callback_t *local_58;
  undefined1 local_50 [8];
  string namebuf;
  
  materials.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)readMatFn;
  local_a8 = err;
  local_68 = warn;
  local_60 = user_data;
  local_58 = callback;
  std::__cxx11::stringstream::stringstream(local_4b0);
  material_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&material_map;
  material_map._M_t._M_impl._0_4_ = 0;
  material_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  material_map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  material_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  indices.super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  piStack_98 = (pointer)0x0;
  indices.super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  materials.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_168 = (undefined1  [8])0x0;
  materials.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_148 = (undefined1  [8])0x0;
  names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  material_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       material_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)auStack_148,2);
  auStack_128 = (undefined1  [8])0x0;
  names_out.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  names_out.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  names_out.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&linebuf._M_string_length;
  linebuf._M_dataplus._M_p = (pointer)0x0;
  linebuf._M_string_length._0_1_ = 0;
  local_a0 = local_278;
  linebuf.field_2._8_8_ = inStream;
LAB_00118ebd:
  do {
    psVar25 = &material_map._M_t._M_impl.super__Rb_tree_header._M_node_count;
    iVar7 = std::istream::peek();
    if (iVar7 == -1) {
      if (local_a8 != (string *)0x0) {
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::_M_append
                  ((char *)local_a8,material_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
        if ((int *)material_map._M_t._M_impl.super__Rb_tree_header._M_node_count !=
            &idx.texcoord_index) {
          operator_delete((void *)material_map._M_t._M_impl.super__Rb_tree_header._M_node_count,
                          CONCAT71(stack0xfffffffffffffd19,(undefined1)idx.texcoord_index) + 1);
        }
      }
      if (names_out.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage != (pointer)&linebuf._M_string_length) {
        operator_delete(names_out.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,
                        CONCAT71(linebuf._M_string_length._1_7_,(undefined1)linebuf._M_string_length
                                ) + 1);
      }
      if (auStack_128 != (undefined1  [8])0x0) {
        operator_delete((void *)auStack_128,
                        (long)names_out.
                              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)auStack_128);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)auStack_148);
      std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::~vector
                ((vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *)auStack_168);
      if (piStack_98 != (pointer)0x0) {
        operator_delete(piStack_98,
                        (long)indices.
                              super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)piStack_98);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   *)local_328);
      std::__cxx11::stringstream::~stringstream(local_4b0);
      std::ios_base::~ios_base(local_430);
      return true;
    }
    safeGetline(inStream,(string *)
                         &names_out.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
    ppcVar5 = names_out.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  } while (linebuf._M_dataplus._M_p == (pointer)0x0);
  if (linebuf._M_dataplus._M_p
      [(long)names_out.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage + -1] == '\n') goto code_r0x00118ef7;
  goto LAB_00118f11;
code_r0x00118ef7:
  linebuf._M_dataplus._M_p = linebuf._M_dataplus._M_p + -1;
  *((long)names_out.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage + linebuf._M_dataplus._M_p) = '\0';
  if (linebuf._M_dataplus._M_p == (pointer)0x0) goto LAB_00118ebd;
LAB_00118f11:
  if (linebuf._M_dataplus._M_p
      [(long)names_out.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage + -1] == '\r') {
    linebuf._M_dataplus._M_p = linebuf._M_dataplus._M_p + -1;
    *((long)names_out.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage + linebuf._M_dataplus._M_p) = '\0';
    if (linebuf._M_dataplus._M_p == (pointer)0x0) goto LAB_00118ebd;
    sVar10 = strspn((char *)names_out.
                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage," \t");
    if (ppcVar5 == (pointer)0x0) {
      __assert_fail("token",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/einsteinx2[P]glex/deps/shared/objl/tiny_obj_loader.h"
                    ,0xaa3,
                    "bool tinyobj::LoadObjWithCallback(std::istream &, const callback_t &, void *, MaterialReader *, std::string *, std::string *)"
                   );
    }
  }
  else {
    sVar10 = strspn((char *)names_out.
                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage," \t");
  }
  pbVar24 = (byte *)((long)ppcVar5 + sVar10);
  bVar1 = *pbVar24;
  if (bVar1 < 0x66) {
    if ((bVar1 == 0) || (bVar1 == 0x23)) goto LAB_00118ebd;
  }
  else if (bVar1 == 0x66) {
    if ((pbVar24[1] == 0x20) || (pbVar24[1] == 9)) {
      sVar10 = strspn((char *)(pbVar24 + 2)," \t");
      if (indices.super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
          super__Vector_impl_data._M_start != piStack_98) {
        indices.super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
        super__Vector_impl_data._M_start = piStack_98;
      }
      pbVar24 = pbVar24 + sVar10 + 2;
      while ((0xd < *pbVar24 || ((0x2401U >> (*pbVar24 & 0x1f) & 1) == 0))) {
        iVar8 = atoi((char *)pbVar24);
        sVar10 = strcspn((char *)pbVar24,"/ \t\r");
        pbVar23 = pbVar24 + sVar10;
        iVar7 = 0;
        if (pbVar24[sVar10] == 0x2f) {
          if (pbVar23[1] == 0x2f) {
            pbVar23 = pbVar23 + 2;
            iVar9 = 0;
          }
          else {
            pbVar24 = pbVar23 + 1;
            iVar9 = atoi((char *)pbVar24);
            sVar10 = strcspn((char *)pbVar24,"/ \t\r");
            pbVar23 = pbVar24 + sVar10;
            if (pbVar24[sVar10] != 0x2f) goto LAB_00119212;
            pbVar23 = pbVar23 + 1;
          }
          iVar7 = atoi((char *)pbVar23);
          sVar10 = strcspn((char *)pbVar23,"/ \t\r");
          pbVar23 = pbVar23 + sVar10;
        }
        else {
          iVar9 = 0;
          iVar7 = 0;
        }
LAB_00119212:
        material_map._M_t._M_impl.super__Rb_tree_header._M_node_count = CONCAT44(iVar7,iVar8);
        idx.vertex_index = iVar9;
        if (indices.super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
            super__Vector_impl_data._M_start ==
            indices.super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<tinyobj::index_t,std::allocator<tinyobj::index_t>>::
          _M_realloc_insert<tinyobj::index_t_const&>
                    ((vector<tinyobj::index_t,std::allocator<tinyobj::index_t>> *)&piStack_98,
                     (iterator)
                     indices.super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (index_t *)&material_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
        }
        else {
          (indices.super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
           super__Vector_impl_data._M_start)->texcoord_index = iVar9;
          (indices.super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
           super__Vector_impl_data._M_start)->vertex_index = iVar8;
          (indices.super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
           super__Vector_impl_data._M_start)->normal_index = iVar7;
          indices.super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
          super__Vector_impl_data._M_start =
               indices.super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
               _M_impl.super__Vector_impl_data._M_start + 1;
        }
        sVar10 = strspn((char *)pbVar23," \t\r");
        pbVar24 = pbVar23 + sVar10;
      }
      pcVar11 = *(code **)(local_58 + 0x18);
      inStream = (istream *)linebuf.field_2._8_8_;
      if ((pcVar11 == (code *)0x0) ||
         ((long)indices.super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                _M_impl.super__Vector_impl_data._M_start - (long)piStack_98 == 0))
      goto LAB_00118ebd;
      uVar19 = ((long)indices.
                      super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                      _M_impl.super__Vector_impl_data._M_start - (long)piStack_98 >> 2) *
               -0x5555555555555555;
      auVar18 = (undefined1  [8])piStack_98;
      goto LAB_001192be;
    }
  }
  else if (bVar1 == 0x76) {
    bVar2 = pbVar24[1];
    if (bVar2 < 0x6e) {
      if ((bVar2 == 9) || (bVar2 == 0x20)) {
        sVar10 = strspn((char *)(pbVar24 + 2)," \t");
        pbVar24 = pbVar24 + sVar10 + 2;
        sVar10 = strcspn((char *)pbVar24," \t\r");
        pbVar23 = pbVar24 + sVar10;
        material_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        tryParseDouble((char *)pbVar24,(char *)pbVar23,
                       (double *)&material_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
        indices.super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)material_map._M_t._M_impl.super__Rb_tree_header._M_node_count;
        sVar10 = strspn((char *)pbVar23," \t");
        pbVar23 = pbVar23 + sVar10;
        sVar10 = strcspn((char *)pbVar23," \t\r");
        pbVar24 = pbVar23 + sVar10;
        material_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        tryParseDouble((char *)pbVar23,(char *)pbVar24,
                       (double *)&material_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
        sVar3 = material_map._M_t._M_impl.super__Rb_tree_header._M_node_count;
        sVar10 = strspn((char *)pbVar24," \t");
        pbVar24 = pbVar24 + sVar10;
        sVar10 = strcspn((char *)pbVar24," \t\r");
        pbVar23 = pbVar24 + sVar10;
        material_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        psVar25 = &material_map._M_t._M_impl.super__Rb_tree_header._M_node_count;
        tryParseDouble((char *)pbVar24,(char *)pbVar23,(double *)psVar25);
        local_170 = (double)material_map._M_t._M_impl.super__Rb_tree_header._M_node_count;
        sVar10 = strspn((char *)pbVar23," \t");
        pbVar23 = pbVar23 + sVar10;
        sVar10 = strcspn((char *)pbVar23," \t\r");
        material_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0x3ff0000000000000;
        tryParseDouble((char *)pbVar23,(char *)(pbVar23 + sVar10),(double *)psVar25);
        if (*(code **)local_58 != (code *)0x0) {
          (**(code **)local_58)
                    ((float)(double)indices.
                                    super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (float)(double)sVar3,(float)local_170,
                     (float)(double)material_map._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     local_60);
        }
        goto LAB_00118ebd;
      }
    }
    else if (bVar2 == 0x6e) {
      if ((pbVar24[2] == 0x20) || (pbVar24[2] == 9)) {
        sVar10 = strspn((char *)(pbVar24 + 3)," \t");
        pbVar24 = pbVar24 + sVar10 + 3;
        sVar10 = strcspn((char *)pbVar24," \t\r");
        pbVar23 = pbVar24 + sVar10;
        material_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        tryParseDouble((char *)pbVar24,(char *)pbVar23,
                       (double *)&material_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
        indices.super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)material_map._M_t._M_impl.super__Rb_tree_header._M_node_count;
        sVar10 = strspn((char *)pbVar23," \t");
        pbVar23 = pbVar23 + sVar10;
        sVar10 = strcspn((char *)pbVar23," \t\r");
        pbVar24 = pbVar23 + sVar10;
        material_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        tryParseDouble((char *)pbVar23,(char *)pbVar24,
                       (double *)&material_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
        sVar3 = material_map._M_t._M_impl.super__Rb_tree_header._M_node_count;
        sVar10 = strspn((char *)pbVar24," \t");
        pbVar24 = pbVar24 + sVar10;
        sVar10 = strcspn((char *)pbVar24," \t\r");
        material_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        tryParseDouble((char *)pbVar24,(char *)(pbVar24 + sVar10),
                       (double *)&material_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
        if (*(code **)(local_58 + 8) != (code *)0x0) {
          (**(code **)(local_58 + 8))
                    ((float)(double)indices.
                                    super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (float)(double)sVar3,
                     (float)(double)material_map._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     local_60);
        }
        goto LAB_00118ebd;
      }
    }
    else if ((bVar2 == 0x74) && ((pbVar24[2] == 0x20 || (pbVar24[2] == 9)))) {
      sVar10 = strspn((char *)(pbVar24 + 3)," \t");
      pbVar24 = pbVar24 + sVar10 + 3;
      sVar10 = strcspn((char *)pbVar24," \t\r");
      pbVar23 = pbVar24 + sVar10;
      material_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      tryParseDouble((char *)pbVar24,(char *)pbVar23,
                     (double *)&material_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
      indices.super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)material_map._M_t._M_impl.super__Rb_tree_header._M_node_count;
      sVar10 = strspn((char *)pbVar23," \t");
      pbVar23 = pbVar23 + sVar10;
      sVar10 = strcspn((char *)pbVar23," \t\r");
      pbVar24 = pbVar23 + sVar10;
      material_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      tryParseDouble((char *)pbVar23,(char *)pbVar24,
                     (double *)&material_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
      sVar3 = material_map._M_t._M_impl.super__Rb_tree_header._M_node_count;
      sVar10 = strspn((char *)pbVar24," \t");
      pbVar24 = pbVar24 + sVar10;
      sVar10 = strcspn((char *)pbVar24," \t\r");
      material_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      tryParseDouble((char *)pbVar24,(char *)(pbVar24 + sVar10),
                     (double *)&material_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
      if (*(code **)(local_58 + 0x10) != (code *)0x0) {
        (**(code **)(local_58 + 0x10))
                  ((float)(double)indices.
                                  super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (float)(double)sVar3,
                   (float)(double)material_map._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   local_60);
      }
      goto LAB_00118ebd;
    }
  }
  iVar7 = strncmp((char *)pbVar24,"usemtl",6);
  if ((iVar7 != 0) || ((pbVar24[6] != 0x20 && (pbVar24[6] != 9)))) {
    iVar7 = strncmp((char *)pbVar24,"mtllib",6);
    pbVar4 = names.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    auVar18 = auStack_148;
    if ((iVar7 == 0) && ((pbVar24[6] == 0x20 || (pbVar24[6] == 9)))) {
      if (materials.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
        auStack_e8 = (undefined1  [8])0x0;
        filenames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        filenames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        std::__cxx11::string::string((string *)psVar25,(char *)(pbVar24 + 7),(allocator *)local_50);
        SplitString((string *)psVar25,(char)auStack_e8,elems);
        if ((int *)material_map._M_t._M_impl.super__Rb_tree_header._M_node_count !=
            &idx.texcoord_index) {
          operator_delete((void *)material_map._M_t._M_impl.super__Rb_tree_header._M_node_count,
                          CONCAT71(stack0xfffffffffffffd19,(undefined1)idx.texcoord_index) + 1);
        }
        if (auStack_e8 ==
            (undefined1  [8])
            filenames.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          if (local_68 != (string *)0x0) {
            std::__cxx11::string::append((char *)local_68);
          }
        }
        else {
          lVar13 = 0;
          uVar19 = 0;
          do {
            material_map._M_t._M_impl.super__Rb_tree_header._M_node_count =
                 (size_t)&idx.texcoord_index;
            idx.vertex_index = 0;
            idx.normal_index = 0;
            idx.texcoord_index._0_1_ = 0;
            local_50 = (undefined1  [8])&namebuf._M_string_length;
            namebuf._M_dataplus._M_p = (pointer)0x0;
            namebuf._M_string_length._0_1_ = 0;
            std::__cxx11::string::string
                      ((string *)&local_c8,*(char **)((long)auStack_e8 + lVar13),&local_69);
            cVar6 = (**(code **)(((materials.
                                   super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage)->name).
                                 _M_dataplus._M_p + 0x10))
                              (materials.
                               super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (string *)&local_c8,auStack_168,local_328,
                               &material_map._M_t._M_impl.super__Rb_tree_header._M_node_count,
                               (value_type *)local_50);
            if (local_c8 != &local_b8) {
              operator_delete(local_c8,local_b8 + 1);
            }
            if ((local_68 != (string *)0x0) && (idx._0_8_ != 0)) {
              std::__cxx11::string::_M_append
                        ((char *)local_68,
                         material_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
            }
            if ((local_a8 != (string *)0x0) && (namebuf._M_dataplus._M_p != (pointer)0x0)) {
              std::__cxx11::string::_M_append((char *)local_a8,(ulong)local_50);
            }
            if (local_50 != (undefined1  [8])&namebuf._M_string_length) {
              operator_delete((void *)local_50,
                              CONCAT71(namebuf._M_string_length._1_7_,
                                       (undefined1)namebuf._M_string_length) + 1);
            }
            if ((int *)material_map._M_t._M_impl.super__Rb_tree_header._M_node_count !=
                &idx.texcoord_index) {
              operator_delete((void *)material_map._M_t._M_impl.super__Rb_tree_header._M_node_count,
                              CONCAT71(stack0xfffffffffffffd19,(undefined1)idx.texcoord_index) + 1);
            }
            if (cVar6 != '\0') {
              if (*(code **)(local_58 + 0x28) == (code *)0x0) goto LAB_00119b1c;
              if ((undefined1  [8])
                  materials.
                  super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>.
                  _M_impl.super__Vector_impl_data._M_start == auStack_168) goto LAB_00119d5f;
              (**(code **)(local_58 + 0x28))
                        (local_60,auStack_168,
                         ((long)materials.
                                super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                ._M_impl.super__Vector_impl_data._M_start - (long)auStack_168 >> 3)
                         * 0x63fb9aeb1fdcd759);
              goto LAB_00119b1c;
            }
            uVar19 = uVar19 + 1;
            lVar13 = lVar13 + 0x20;
          } while (uVar19 < (ulong)((long)filenames.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start -
                                    (long)auStack_e8 >> 5));
          if (local_68 != (string *)0x0) {
            std::__cxx11::string::append((char *)local_68);
          }
        }
LAB_00119b1c:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)auStack_e8);
      }
      goto LAB_00118ebd;
    }
    if (bVar1 != 0x6f) {
      if ((bVar1 != 0x67) || ((pbVar24[1] != 0x20 && (pbVar24[1] != 9)))) goto LAB_00118ebd;
      if ((undefined1  [8])
          names.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != auStack_148) {
        paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)((long)auStack_148 + 0x10);
        do {
          plVar14 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (paVar21 + -1))->_M_dataplus)._M_p;
          if (paVar21 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)plVar14) {
            operator_delete(plVar14,paVar21->_M_allocated_capacity + 1);
          }
          pbVar22 = (pointer)(paVar21 + 1);
          paVar21 = paVar21 + 2;
        } while (pbVar22 != pbVar4);
        names.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)auVar18;
        inStream = (istream *)linebuf.field_2._8_8_;
      }
      psVar25 = &material_map._M_t._M_impl.super__Rb_tree_header._M_node_count;
      while( true ) {
        if ((*pbVar24 < 0xe) && ((0x2401U >> (*pbVar24 & 0x1f) & 1) != 0)) break;
        local_50 = (undefined1  [8])&namebuf._M_string_length;
        namebuf._M_dataplus._M_p = (pointer)0x0;
        namebuf._M_string_length._0_1_ = 0;
        sVar10 = strspn((char *)pbVar24," \t");
        pbVar24 = pbVar24 + sVar10;
        sVar10 = strcspn((char *)pbVar24," \t\r");
        pbVar23 = pbVar24 + sVar10;
        material_map._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)&idx.texcoord_index;
        std::__cxx11::string::_M_construct<char_const*>((string *)psVar25,pbVar24,pbVar23);
        std::__cxx11::string::operator=((string *)local_50,(string *)psVar25);
        if ((int *)material_map._M_t._M_impl.super__Rb_tree_header._M_node_count !=
            &idx.texcoord_index) {
          operator_delete((void *)material_map._M_t._M_impl.super__Rb_tree_header._M_node_count,
                          CONCAT71(stack0xfffffffffffffd19,(undefined1)idx.texcoord_index) + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)auStack_148,(value_type *)local_50);
        sVar10 = strspn((char *)pbVar23," \t\r");
        if (local_50 != (undefined1  [8])&namebuf._M_string_length) {
          operator_delete((void *)local_50,
                          CONCAT71(namebuf._M_string_length._1_7_,
                                   (undefined1)namebuf._M_string_length) + 1);
        }
        pbVar24 = pbVar23 + sVar10;
        inStream = (istream *)linebuf.field_2._8_8_;
      }
      if ((long)names.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start - (long)auStack_148 == 0) {
        __assert_fail("names.size() > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/einsteinx2[P]glex/deps/shared/objl/tiny_obj_loader.h"
                      ,0xb42,
                      "bool tinyobj::LoadObjWithCallback(std::istream &, const callback_t &, void *, MaterialReader *, std::string *, std::string *)"
                     );
      }
      if (*(code **)(local_58 + 0x30) == (code *)0x0) goto LAB_00118ebd;
      uVar19 = (long)names.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start - (long)auStack_148 >> 5;
      if (uVar19 < 2) {
        (**(code **)(local_58 + 0x30))(local_60,0,0);
        goto LAB_00118ebd;
      }
      std::vector<const_char_*,_std::allocator<const_char_*>_>::resize
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)auStack_128,uVar19 - 1);
      if ((undefined1  [8])
          names_out.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_start == auStack_128) {
        uVar19 = 0;
      }
      else {
        lVar13 = 0x20;
        uVar20 = 0;
        do {
          *(undefined8 *)((int *)auStack_128 + uVar20 * 2) =
               *(undefined8 *)((long)&((_Alloc_hider *)auStack_148)->_M_p + lVar13);
          uVar20 = uVar20 + 1;
          uVar19 = (long)names_out.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                         _M_impl.super__Vector_impl_data._M_start - (long)auStack_128 >> 3;
          lVar13 = lVar13 + 0x20;
        } while (uVar20 < uVar19);
      }
      if ((undefined1  [8])
          names_out.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_start == auStack_128) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,
                   uVar19);
LAB_00119d5f:
        uVar15 = std::__throw_out_of_range_fmt
                           ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                            ,0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)auStack_e8);
        if (names_out.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage != (pointer)&linebuf._M_string_length) {
          operator_delete(names_out.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,
                          CONCAT71(linebuf._M_string_length._1_7_,
                                   (undefined1)linebuf._M_string_length) + 1);
        }
        if (auStack_128 != (undefined1  [8])0x0) {
          operator_delete((void *)auStack_128,
                          (long)names_out.
                                super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)auStack_128);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)auStack_148);
        std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::~vector
                  ((vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *)auStack_168)
        ;
        if (piStack_98 != (pointer)0x0) {
          operator_delete(piStack_98,
                          (long)indices.
                                super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)piStack_98);
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     *)local_328);
        std::__cxx11::stringstream::~stringstream(local_4b0);
        std::ios_base::~ios_base(local_430);
        _Unwind_Resume(uVar15);
      }
      pcVar11 = *(code **)(local_58 + 0x30);
      auVar18 = auStack_128;
LAB_001192be:
      (*pcVar11)(local_60,auVar18,uVar19);
      goto LAB_00118ebd;
    }
    if ((pbVar24[1] != 0x20) && (pbVar24[1] != 9)) goto LAB_00118ebd;
    std::__cxx11::stringstream::stringstream((stringstream *)psVar25);
    sVar10 = strlen((char *)(pbVar24 + 2));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&idx.texcoord_index,(char *)(pbVar24 + 2),sVar10);
    std::__cxx11::stringbuf::str();
    if (*(code **)(local_58 + 0x38) != (code *)0x0) {
      (**(code **)(local_58 + 0x38))(local_60,local_50);
    }
    goto LAB_00119bb9;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)psVar25);
  sVar10 = strlen((char *)(pbVar24 + 7));
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&idx.texcoord_index,(char *)(pbVar24 + 7),sVar10);
  std::__cxx11::stringbuf::str();
  iVar12 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   *)local_328,(value_type *)local_50);
  if (iVar12._M_node == (_Base_ptr)&material_map) {
    pcVar11 = *(code **)(local_58 + 0x20);
    if (pcVar11 == (code *)0x0 && local_68 != (string *)0x0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_e8
                     ,"material [ ",(value_type *)local_50);
      plVar14 = (long *)std::__cxx11::string::append((char *)auStack_e8);
      plVar16 = plVar14 + 2;
      if ((long *)*plVar14 == plVar16) {
        local_b8 = *plVar16;
        lStack_b0 = plVar14[3];
        local_c8 = &local_b8;
      }
      else {
        local_b8 = *plVar16;
        local_c8 = (long *)*plVar14;
      }
      local_c0 = plVar14[1];
      *plVar14 = (long)plVar16;
      plVar14[1] = 0;
      *(undefined1 *)(plVar14 + 2) = 0;
      std::__cxx11::string::_M_append((char *)local_68,(ulong)local_c8);
      if (local_c8 != &local_b8) {
        operator_delete(local_c8,local_b8 + 1);
      }
      if (auStack_e8 !=
          (undefined1  [8])
          &filenames.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish) {
        operator_delete((void *)auStack_e8,
                        (ulong)((long)&((filenames.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus).
                                       _M_p + 1));
      }
      _Var17 = ~_S_red;
      goto LAB_00119ba2;
    }
    _Var17 = ~_S_red;
  }
  else {
    _Var17 = iVar12._M_node[2]._M_color;
LAB_00119ba2:
    pcVar11 = *(code **)(local_58 + 0x20);
  }
  if (pcVar11 != (code *)0x0) {
    (*pcVar11)(local_60,local_50,_Var17);
  }
LAB_00119bb9:
  if (local_50 != (undefined1  [8])&namebuf._M_string_length) {
    operator_delete((void *)local_50,
                    CONCAT71(namebuf._M_string_length._1_7_,(undefined1)namebuf._M_string_length) +
                    1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)psVar25);
  std::ios_base::~ios_base(local_a0);
  goto LAB_00118ebd;
}

Assistant:

bool LoadObjWithCallback(std::istream &inStream, const callback_t &callback,
                         void *user_data /*= NULL*/,
                         MaterialReader *readMatFn /*= NULL*/,
                         std::string *warn, /* = NULL*/
                         std::string *err /*= NULL*/) {
  std::stringstream errss;

  // material
  std::map<std::string, int> material_map;
  int material_id = -1;  // -1 = invalid

  std::vector<index_t> indices;
  std::vector<material_t> materials;
  std::vector<std::string> names;
  names.reserve(2);
  std::vector<const char *> names_out;

  std::string linebuf;
  while (inStream.peek() != -1) {
    safeGetline(inStream, linebuf);

    // Trim newline '\r\n' or '\n'
    if (linebuf.size() > 0) {
      if (linebuf[linebuf.size() - 1] == '\n')
        linebuf.erase(linebuf.size() - 1);
    }
    if (linebuf.size() > 0) {
      if (linebuf[linebuf.size() - 1] == '\r')
        linebuf.erase(linebuf.size() - 1);
    }

    // Skip if empty line.
    if (linebuf.empty()) {
      continue;
    }

    // Skip leading space.
    const char *token = linebuf.c_str();
    token += strspn(token, " \t");

    assert(token);
    if (token[0] == '\0') continue;  // empty line

    if (token[0] == '#') continue;  // comment line

    // vertex
    if (token[0] == 'v' && IS_SPACE((token[1]))) {
      token += 2;
      // TODO(syoyo): Support parsing vertex color extension.
      real_t x, y, z, w;  // w is optional. default = 1.0
      parseV(&x, &y, &z, &w, &token);
      if (callback.vertex_cb) {
        callback.vertex_cb(user_data, x, y, z, w);
      }
      continue;
    }

    // normal
    if (token[0] == 'v' && token[1] == 'n' && IS_SPACE((token[2]))) {
      token += 3;
      real_t x, y, z;
      parseReal3(&x, &y, &z, &token);
      if (callback.normal_cb) {
        callback.normal_cb(user_data, x, y, z);
      }
      continue;
    }

    // texcoord
    if (token[0] == 'v' && token[1] == 't' && IS_SPACE((token[2]))) {
      token += 3;
      real_t x, y, z;  // y and z are optional. default = 0.0
      parseReal3(&x, &y, &z, &token);
      if (callback.texcoord_cb) {
        callback.texcoord_cb(user_data, x, y, z);
      }
      continue;
    }

    // face
    if (token[0] == 'f' && IS_SPACE((token[1]))) {
      token += 2;
      token += strspn(token, " \t");

      indices.clear();
      while (!IS_NEW_LINE(token[0])) {
        vertex_index_t vi = parseRawTriple(&token);

        index_t idx;
        idx.vertex_index = vi.v_idx;
        idx.normal_index = vi.vn_idx;
        idx.texcoord_index = vi.vt_idx;

        indices.push_back(idx);
        size_t n = strspn(token, " \t\r");
        token += n;
      }

      if (callback.index_cb && indices.size() > 0) {
        callback.index_cb(user_data, &indices.at(0),
                          static_cast<int>(indices.size()));
      }

      continue;
    }

    // use mtl
    if ((0 == strncmp(token, "usemtl", 6)) && IS_SPACE((token[6]))) {
      token += 7;
      std::stringstream ss;
      ss << token;
      std::string namebuf = ss.str();

      int newMaterialId = -1;
      std::map<std::string, int>::const_iterator it = material_map.find(namebuf);
      if (it != material_map.end()) {
        newMaterialId = it->second;
      } else {
        // { warn!! material not found }
        if (warn && (!callback.usemtl_cb)) {
          (*warn) += "material [ " + namebuf + " ] not found in .mtl\n";
        }
      }

      if (newMaterialId != material_id) {
        material_id = newMaterialId;
      }

      if (callback.usemtl_cb) {
        callback.usemtl_cb(user_data, namebuf.c_str(), material_id);
      }

      continue;
    }

    // load mtl
    if ((0 == strncmp(token, "mtllib", 6)) && IS_SPACE((token[6]))) {
      if (readMatFn) {
        token += 7;

        std::vector<std::string> filenames;
        SplitString(std::string(token), ' ', filenames);

        if (filenames.empty()) {
          if (warn) {
            (*warn) +=
                "Looks like empty filename for mtllib. Use default "
                "material. \n";
          }
        } else {
          bool found = false;
          for (size_t s = 0; s < filenames.size(); s++) {
            std::string warn_mtl;
            std::string err_mtl;
            bool ok = (*readMatFn)(filenames[s].c_str(), &materials,
                                   &material_map, &warn_mtl, &err_mtl);

            if (warn && (!warn_mtl.empty())) {
              (*warn) += warn_mtl;  // This should be warn message.
            }

            if (err && (!err_mtl.empty())) {
              (*err) += err_mtl;
            }

            if (ok) {
              found = true;
              break;
            }
          }

          if (!found) {
            if (warn) {
              (*warn) +=
                  "Failed to load material file(s). Use default "
                  "material.\n";
            }
          } else {
            if (callback.mtllib_cb) {
              callback.mtllib_cb(user_data, &materials.at(0),
                                 static_cast<int>(materials.size()));
            }
          }
        }
      }

      continue;
    }

    // group name
    if (token[0] == 'g' && IS_SPACE((token[1]))) {
      names.clear();

      while (!IS_NEW_LINE(token[0])) {
        std::string str = parseString(&token);
        names.push_back(str);
        token += strspn(token, " \t\r");  // skip tag
      }

      assert(names.size() > 0);

      if (callback.group_cb) {
        if (names.size() > 1) {
          // create const char* array.
          names_out.resize(names.size() - 1);
          for (size_t j = 0; j < names_out.size(); j++) {
            names_out[j] = names[j + 1].c_str();
          }
          callback.group_cb(user_data, &names_out.at(0),
                            static_cast<int>(names_out.size()));

        } else {
          callback.group_cb(user_data, NULL, 0);
        }
      }

      continue;
    }

    // object name
    if (token[0] == 'o' && IS_SPACE((token[1]))) {
      // @todo { multiple object name? }
      token += 2;

      std::stringstream ss;
      ss << token;
      std::string object_name = ss.str();

      if (callback.object_cb) {
        callback.object_cb(user_data, object_name.c_str());
      }

      continue;
    }

#if 0  // @todo
    if (token[0] == 't' && IS_SPACE(token[1])) {
      tag_t tag;

      token += 2;
      std::stringstream ss;
      ss << token;
      tag.name = ss.str();

      token += tag.name.size() + 1;

      tag_sizes ts = parseTagTriple(&token);

      tag.intValues.resize(static_cast<size_t>(ts.num_ints));

      for (size_t i = 0; i < static_cast<size_t>(ts.num_ints); ++i) {
        tag.intValues[i] = atoi(token);
        token += strcspn(token, "/ \t\r") + 1;
      }

      tag.floatValues.resize(static_cast<size_t>(ts.num_reals));
      for (size_t i = 0; i < static_cast<size_t>(ts.num_reals); ++i) {
        tag.floatValues[i] = parseReal(&token);
        token += strcspn(token, "/ \t\r") + 1;
      }

      tag.stringValues.resize(static_cast<size_t>(ts.num_strings));
      for (size_t i = 0; i < static_cast<size_t>(ts.num_strings); ++i) {
        std::stringstream ss;
        ss << token;
        tag.stringValues[i] = ss.str();
        token += tag.stringValues[i].size() + 1;
      }

      tags.push_back(tag);
    }
#endif

    // Ignore unknown command.
  }

  if (err) {
    (*err) += errss.str();
  }

  return true;
}